

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::
MaybeAlive<Lib::Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>_>_>
::~MaybeAlive(MaybeAlive<Lib::Stack<std::unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>_>_>
              *this)

{
  ulong uVar1;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
  *puVar2;
  unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
  *this_00;
  
  *this->_alive = false;
  this_00 = (this->_self)._cursor;
  puVar2 = (this->_self)._stack;
  while (this_00 != puVar2) {
    this_00 = this_00 + -1;
    std::
    unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
    ::~unique_ptr(this_00);
    puVar2 = (this->_self)._stack;
  }
  if (puVar2 != (unique_ptr<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
                 *)0x0) {
    uVar1 = (this->_self)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar1 == 0) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_false>
      ._M_head_impl = (FastInstancesIterator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar2;
    }
    else if (uVar1 < 0x11) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_false>
      ._M_head_impl = (FastInstancesIterator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar2;
    }
    else if (uVar1 < 0x19) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_false>
      ._M_head_impl = (FastInstancesIterator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar2;
    }
    else if (uVar1 < 0x21) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_false>
      ._M_head_impl = (FastInstancesIterator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar2;
    }
    else if (uVar1 < 0x31) {
      (puVar2->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_false>
      ._M_head_impl = (FastInstancesIterator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar2;
    }
    else {
      if (0x40 < uVar1) {
        operator_delete(puVar2,0x10);
        return;
      }
      (puVar2->_M_t).
      super___uniq_ptr_impl<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_std::default_delete<Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator>_>
      .
      super__Head_base<0UL,_Indexing::SubstitutionTree<Indexing::LiteralClause>::FastInstancesIterator_*,_false>
      ._M_head_impl = (FastInstancesIterator *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar2;
    }
  }
  return;
}

Assistant:

~MaybeAlive() { *_alive = false; }